

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_vsplt(DisasContext_conflict10 *ctx,int vece)

{
  uint uVar1;
  byte bVar2;
  
  if (ctx->altivec_enabled != false) {
    bVar2 = (byte)vece;
    uVar1 = ctx->opcode;
    tcg_gen_gvec_dup_mem_ppc64
              (ctx->uc->tcg_ctx,vece,(uVar1 >> 0x11 & 0x1f0) + 0x12d20,
               ((((uVar1 >> 0x10) << (bVar2 & 0x1f) & 0xf | uVar1 >> 7 & 0x1f0) + 0x12d20 ^ 0xf) >>
               (bVar2 & 0x1f)) << (bVar2 & 0x1f),0x10,0x10);
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vsplt(DisasContext *ctx, int vece)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int uimm, dofs, bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    uimm = UIMM5(ctx->opcode);
    bofs = avr_full_offset(rB(ctx->opcode));
    dofs = avr_full_offset(rD(ctx->opcode));

    /* Experimental testing shows that hardware masks the immediate.  */
    bofs += (uimm << vece) & 15;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 15;
    bofs &= ~((1 << vece) - 1);
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, vece, dofs, bofs, 16, 16);
}